

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O1

void __thiscall r_comp::Image::add_object(Image *this,Code *object)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  pointer ppSVar3;
  pointer ppSVar4;
  char cVar5;
  mapped_type *pmVar6;
  SysObject *this_00;
  size_t sVar7;
  Code *pCVar8;
  long lVar9;
  uint *puVar10;
  ulong uVar11;
  Image *this_01;
  __node_base_ptr p_Var12;
  __node_base_ptr p_Var13;
  size_t sVar14;
  Code *local_38;
  
  uVar1 = (this->ptrs_to_indices)._M_h._M_bucket_count;
  uVar11 = (ulong)object % uVar1;
  p_Var12 = (this->ptrs_to_indices)._M_h._M_buckets[uVar11];
  p_Var13 = (__node_base_ptr)0x0;
  if ((p_Var12 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var12->_M_nxt, p_Var13 = p_Var12, (Code *)p_Var12->_M_nxt[1]._M_nxt != object)) {
    while (p_Var12 = p_Var2, p_Var2 = p_Var12->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var13 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar11) ||
         (p_Var13 = p_Var12, (Code *)p_Var2[1]._M_nxt == object)) goto LAB_0013c7ba;
    }
    p_Var13 = (__node_base_ptr)0x0;
  }
LAB_0013c7ba:
  if ((p_Var13 == (__node_base_ptr)0x0) || (p_Var13->_M_nxt == (_Hash_node_base *)0x0)) {
    ppSVar3 = (this->code_segment).objects.m_vector.
              super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppSVar4 = (this->code_segment).objects.m_vector.
              super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_38 = object;
    pmVar6 = std::__detail::
             _Map_base<r_code::Code_*,_std::pair<r_code::Code_*const,_unsigned_long>,_std::allocator<std::pair<r_code::Code_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<r_code::Code_*>,_std::hash<r_code::Code_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<r_code::Code_*,_std::pair<r_code::Code_*const,_unsigned_long>,_std::allocator<std::pair<r_code::Code_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<r_code::Code_*>,_std::hash<r_code::Code_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->ptrs_to_indices,&local_38);
    *pmVar6 = (long)ppSVar3 - (long)ppSVar4 >> 3;
    this_00 = (SysObject *)operator_new(0x70);
    r_code::SysObject::SysObject(this_00,local_38);
    this_01 = this;
    add_sys_object(this,this_00);
    sVar7 = get_reference_count(this_01,local_38);
    if (sVar7 != 0) {
      sVar14 = 0;
      do {
        pCVar8 = (Code *)(**(code **)(*(long *)local_38 + 0x48))();
        lVar9 = (**(code **)(*(long *)pCVar8 + 0x10))(pCVar8);
        if ((lVar9 == 0xffffffff) ||
           (cVar5 = (**(code **)(*(long *)pCVar8 + 0x70))(pCVar8), cVar5 != '\0')) {
          add_object(this,pCVar8);
        }
        sVar14 = sVar14 + 1;
      } while (sVar7 != sVar14);
    }
    pCVar8 = local_38;
    puVar10 = r_code::vector<unsigned_int>::operator[]((vector<unsigned_int> *)(this_00 + 0x20),0);
    *puVar10 = (uint)pCVar8;
    puVar10 = r_code::vector<unsigned_int>::operator[]((vector<unsigned_int> *)(this_00 + 0x20),1);
    *puVar10 = (uint)((ulong)pCVar8 >> 0x20);
  }
  return;
}

Assistant:

void Image::add_object(Code *object)
{
    std::unordered_map<Code *, size_t>::iterator it = ptrs_to_indices.find(object);

    if (it != ptrs_to_indices.end()) { // object already there.
        return;
    }

    size_t object_index;
    ptrs_to_indices[object] = object_index = code_segment.objects.as_std()->size();
    SysObject *sys_object = new SysObject(object);
    add_sys_object(sys_object);
    size_t reference_count = get_reference_count(object);

    for (size_t i = 0; i < reference_count; ++i) { // follow reference pointers and recurse.
        Code *reference = object->get_reference(i);

        if (reference->get_oid() == UNDEFINED_OID ||
            reference->is_invalidated()) { // the referenced object is not in the image and will not be added otherwise.
            add_object(reference);
        }
    }

    uintptr_t _object = (uintptr_t)object;
    sys_object->references[0] = (_object & UINT32_MAX);
    sys_object->references[1] = (_object >> 32);
}